

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O2

void pzshape::TPZShapeLinear::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar5 = dVar1 * dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,0);
  dVar1 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,1,0);
  dVar2 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,1);
  dVar4 = *pdVar5;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar5 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar5 = TPZFMatrix<double>::operator()(phi,2,0);
  *pdVar5 = *pdVar5 * 4.0;
  pdVar5 = TPZFMatrix<double>::operator()(dphi,0,2);
  *pdVar5 = *pdVar5 * 4.0;
  return;
}

Assistant:

void TPZShapeLinear::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		
		phi(2,0) = phi(0,0)*phi(1,0);
		dphi(0,2) = dphi(0,0)*phi(1,0)+phi(0,0)*dphi(0,1);
		
		phi(2,0) *= 4.;
		dphi(0,2) *= 4.;
		
	}